

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int read_Folder(archive_read *a,_7z_folder *f)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  void *pvVar4;
  int iVar5;
  _7z_coder *p_Var6;
  byte *pbVar7;
  uchar *puVar8;
  unsigned_long uVar9;
  uchar *puVar10;
  anon_struct_16_2_4d417c8e *paVar11;
  uint64_t *puVar12;
  uint local_5c;
  uint j;
  int attr;
  int simple;
  size_t codec_size;
  uint64_t uStack_40;
  uint i;
  uint64_t numOutStreamsTotal;
  uint64_t numInStreamsTotal;
  uchar *p;
  _7zip *zip;
  _7z_folder *f_local;
  archive_read *a_local;
  
  pvVar4 = a->format->data;
  numOutStreamsTotal = 0;
  uStack_40 = 0;
  memset(f,0,0x68);
  iVar5 = parse_7zip_uint64(a,&f->numCoders);
  if (iVar5 < 0) {
    a_local._4_4_ = -1;
  }
  else if (f->numCoders < 5) {
    p_Var6 = (_7z_coder *)calloc(f->numCoders,0x28);
    f->coders = p_Var6;
    if (f->coders == (_7z_coder *)0x0) {
      a_local._4_4_ = -1;
    }
    else {
      for (codec_size._4_4_ = 0; (ulong)codec_size._4_4_ < f->numCoders;
          codec_size._4_4_ = codec_size._4_4_ + 1) {
        pbVar7 = header_bytes(a,1);
        if (pbVar7 == (byte *)0x0) {
          return -1;
        }
        bVar1 = *pbVar7;
        bVar2 = *pbVar7;
        bVar3 = *pbVar7;
        if ((*pbVar7 & 0x80) != 0) {
          return -1;
        }
        puVar8 = header_bytes(a,(long)(int)(bVar1 & 0xf));
        if (puVar8 == (uchar *)0x0) {
          return -1;
        }
        uVar9 = decode_codec_id(puVar8,(long)(int)(bVar1 & 0xf));
        f->coders[codec_size._4_4_].codec = uVar9;
        if ((bVar2 & 0x10) == 0) {
          f->coders[codec_size._4_4_].numInStreams = 1;
          f->coders[codec_size._4_4_].numOutStreams = 1;
        }
        else {
          iVar5 = parse_7zip_uint64(a,&f->coders[codec_size._4_4_].numInStreams);
          if (iVar5 < 0) {
            return -1;
          }
          if (100000000 < f->coders[codec_size._4_4_].numInStreams) {
            return -1;
          }
          iVar5 = parse_7zip_uint64(a,&f->coders[codec_size._4_4_].numOutStreams);
          if (iVar5 < 0) {
            return -1;
          }
          if (100000000 < f->coders[codec_size._4_4_].numOutStreams) {
            return -1;
          }
        }
        if ((bVar3 & 0x20) != 0) {
          iVar5 = parse_7zip_uint64(a,&f->coders[codec_size._4_4_].propertiesSize);
          if (iVar5 < 0) {
            return -1;
          }
          if (100000000 < f->coders[codec_size._4_4_].propertiesSize) {
            return -1;
          }
          puVar8 = header_bytes(a,f->coders[codec_size._4_4_].propertiesSize);
          if (puVar8 == (uchar *)0x0) {
            return -1;
          }
          puVar10 = (uchar *)malloc(f->coders[codec_size._4_4_].propertiesSize);
          f->coders[codec_size._4_4_].properties = puVar10;
          if (f->coders[codec_size._4_4_].properties == (uchar *)0x0) {
            return -1;
          }
          memcpy(f->coders[codec_size._4_4_].properties,puVar8,
                 f->coders[codec_size._4_4_].propertiesSize);
        }
        numOutStreamsTotal = f->coders[codec_size._4_4_].numInStreams + numOutStreamsTotal;
        uStack_40 = f->coders[codec_size._4_4_].numOutStreams + uStack_40;
      }
      if ((uStack_40 == 0) || (numOutStreamsTotal < uStack_40 - 1)) {
        a_local._4_4_ = -1;
      }
      else {
        f->numBindPairs = uStack_40 - 1;
        if (*(ulong *)((long)pvVar4 + 0x70) < f->numBindPairs) {
          a_local._4_4_ = -1;
        }
        else {
          if (f->numBindPairs == 0) {
            f->bindPairs = (anon_struct_16_2_4d417c8e *)0x0;
          }
          else {
            paVar11 = (anon_struct_16_2_4d417c8e *)calloc(f->numBindPairs,0x10);
            f->bindPairs = paVar11;
            if (f->bindPairs == (anon_struct_16_2_4d417c8e *)0x0) {
              return -1;
            }
          }
          for (codec_size._4_4_ = 0; (ulong)codec_size._4_4_ < f->numBindPairs;
              codec_size._4_4_ = codec_size._4_4_ + 1) {
            iVar5 = parse_7zip_uint64(a,&f->bindPairs[codec_size._4_4_].inIndex);
            if (iVar5 < 0) {
              return -1;
            }
            if (100000000 < f->bindPairs[codec_size._4_4_].inIndex) {
              return -1;
            }
            iVar5 = parse_7zip_uint64(a,&f->bindPairs[codec_size._4_4_].outIndex);
            if (iVar5 < 0) {
              return -1;
            }
            if (100000000 < f->bindPairs[codec_size._4_4_].outIndex) {
              return -1;
            }
          }
          f->numPackedStreams = numOutStreamsTotal - f->numBindPairs;
          puVar12 = (uint64_t *)calloc(f->numPackedStreams,8);
          f->packedStreams = puVar12;
          if (f->packedStreams == (uint64_t *)0x0) {
            a_local._4_4_ = -1;
          }
          else {
            if (f->numPackedStreams == 1) {
              for (codec_size._4_4_ = 0; codec_size._4_4_ < numOutStreamsTotal;
                  codec_size._4_4_ = codec_size._4_4_ + 1) {
                local_5c = 0;
                while (((ulong)local_5c < f->numBindPairs &&
                       (f->bindPairs[local_5c].inIndex != (ulong)codec_size._4_4_))) {
                  local_5c = local_5c + 1;
                }
                if ((ulong)local_5c == f->numBindPairs) break;
              }
              if (codec_size._4_4_ == numOutStreamsTotal) {
                return -1;
              }
              *f->packedStreams = (ulong)codec_size._4_4_;
            }
            else {
              for (codec_size._4_4_ = 0; (ulong)codec_size._4_4_ < f->numPackedStreams;
                  codec_size._4_4_ = codec_size._4_4_ + 1) {
                iVar5 = parse_7zip_uint64(a,f->packedStreams + codec_size._4_4_);
                if (iVar5 < 0) {
                  return -1;
                }
                if (100000000 < f->packedStreams[codec_size._4_4_]) {
                  return -1;
                }
              }
            }
            f->numInStreams = numOutStreamsTotal;
            f->numOutStreams = uStack_40;
            a_local._4_4_ = 0;
          }
        }
      }
    }
  }
  else {
    a_local._4_4_ = -1;
  }
  return a_local._4_4_;
}

Assistant:

static int
read_Folder(struct archive_read *a, struct _7z_folder *f)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	uint64_t numInStreamsTotal = 0;
	uint64_t numOutStreamsTotal = 0;
	unsigned i;

	memset(f, 0, sizeof(*f));

	/*
	 * Read NumCoders.
	 */
	if (parse_7zip_uint64(a, &(f->numCoders)) < 0)
		return (-1);
	if (f->numCoders > 4)
		/* Too many coders. */
		return (-1);

	f->coders = calloc((size_t)f->numCoders, sizeof(*f->coders));
	if (f->coders == NULL)
		return (-1);
	for (i = 0; i< f->numCoders; i++) {
		size_t codec_size;
		int simple, attr;

		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		/*
		 * 0:3 CodecIdSize
		 * 4:  0 - IsSimple
		 *     1 - Is not Simple
		 * 5:  0 - No Attributes
		 *     1 - There are Attributes;
		 * 7:  Must be zero.
		 */
		codec_size = *p & 0xf;
		simple = (*p & 0x10)?0:1;
		attr = *p & 0x20;
		if (*p & 0x80)
			return (-1);/* Not supported. */

		/*
		 * Read Decompression Method IDs.
		 */
		if ((p = header_bytes(a, codec_size)) == NULL)
			return (-1);

		f->coders[i].codec = decode_codec_id(p, codec_size);

		if (simple) {
			f->coders[i].numInStreams = 1;
			f->coders[i].numOutStreams = 1;
		} else {
			if (parse_7zip_uint64(
			    a, &(f->coders[i].numInStreams)) < 0)
				return (-1);
			if (UMAX_ENTRY < f->coders[i].numInStreams)
				return (-1);
			if (parse_7zip_uint64(
			    a, &(f->coders[i].numOutStreams)) < 0)
				return (-1);
			if (UMAX_ENTRY < f->coders[i].numOutStreams)
				return (-1);
		}

		if (attr) {
			if (parse_7zip_uint64(
			    a, &(f->coders[i].propertiesSize)) < 0)
				return (-1);
			if (UMAX_ENTRY < f->coders[i].propertiesSize)
				return (-1);
			if ((p = header_bytes(
			    a, (size_t)f->coders[i].propertiesSize)) == NULL)
				return (-1);
			f->coders[i].properties =
			    malloc((size_t)f->coders[i].propertiesSize);
			if (f->coders[i].properties == NULL)
				return (-1);
			memcpy(f->coders[i].properties, p,
			    (size_t)f->coders[i].propertiesSize);
		}

		numInStreamsTotal += f->coders[i].numInStreams;
		numOutStreamsTotal += f->coders[i].numOutStreams;
	}

	if (numOutStreamsTotal == 0 ||
	    numInStreamsTotal < numOutStreamsTotal-1)
		return (-1);

	f->numBindPairs = numOutStreamsTotal - 1;
	if (zip->header_bytes_remaining < f->numBindPairs)
			return (-1);
	if (f->numBindPairs > 0) {
		f->bindPairs =
			calloc((size_t)f->numBindPairs, sizeof(*f->bindPairs));
		if (f->bindPairs == NULL)
			return (-1);
	} else
		f->bindPairs = NULL;
	for (i = 0; i < f->numBindPairs; i++) {
		if (parse_7zip_uint64(a, &(f->bindPairs[i].inIndex)) < 0)
			return (-1);
		if (UMAX_ENTRY < f->bindPairs[i].inIndex)
			return (-1);
		if (parse_7zip_uint64(a, &(f->bindPairs[i].outIndex)) < 0)
			return (-1);
		if (UMAX_ENTRY < f->bindPairs[i].outIndex)
			return (-1);
	}

	f->numPackedStreams = numInStreamsTotal - f->numBindPairs;
	f->packedStreams =
	    calloc((size_t)f->numPackedStreams, sizeof(*f->packedStreams));
	if (f->packedStreams == NULL)
		return (-1);
	if (f->numPackedStreams == 1) {
		for (i = 0; i < numInStreamsTotal; i++) {
			unsigned j;
			for (j = 0; j < f->numBindPairs; j++) {
				if (f->bindPairs[j].inIndex == i)
					break;
			}
			if (j == f->numBindPairs)
				break;
		}
		if (i == numInStreamsTotal)
			return (-1);
		f->packedStreams[0] = i;
	} else {
		for (i = 0; i < f->numPackedStreams; i++) {
			if (parse_7zip_uint64(a, &(f->packedStreams[i])) < 0)
				return (-1);
			if (UMAX_ENTRY < f->packedStreams[i])
				return (-1);
		}
	}
	f->numInStreams = numInStreamsTotal;
	f->numOutStreams = numOutStreamsTotal;

	return (0);
}